

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O3

void __thiscall TcpConn::OnWrite(TcpConn *this)

{
  ulong uVar1;
  BufferChain *pBVar2;
  uint16_t uVar3;
  int __fd;
  char *pcVar4;
  ssize_t sVar5;
  size_t *psVar6;
  ulong uVar7;
  BufferChain *pBVar8;
  bool bVar9;
  
  pBVar8 = (this->super_Buffer).m_writeHead;
  if (pBVar8 == (BufferChain *)0x0) {
    __assert_fail("m_writeHead != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/TcpConn.cpp"
                  ,0x5d,"virtual void TcpConn::OnWrite()");
  }
  psVar6 = &OnWrite::iov[0].iov_len;
  uVar7 = 0;
  do {
    pcVar4 = BufferChain::GetReadAddr(pBVar8);
    ((iovec *)(psVar6 + -1))->iov_base = pcVar4;
    uVar3 = BufferChain::GetCanReadCount(pBVar8);
    *psVar6 = (ulong)uVar3;
    pBVar8 = pBVar8->nextpkt;
    uVar1 = uVar7 + 1;
    if (pBVar8 == (BufferChain *)0x0) break;
    psVar6 = psVar6 + 2;
    bVar9 = uVar7 < 0xff;
    uVar7 = uVar1;
  } while (bVar9);
  __fd = (*(this->super_PollObj)._vptr_PollObj[2])(this);
  sVar5 = writev(__fd,(iovec *)OnWrite::iov,(int)uVar1);
  if (-1 < sVar5) {
    pBVar8 = (this->super_Buffer).m_writeHead;
    if ((pBVar8 != (BufferChain *)0x0) && (sVar5 != 0)) {
      while (uVar3 = BufferChain::GetCanReadCount(pBVar8), (long)(ulong)uVar3 <= sVar5) {
        uVar3 = BufferChain::GetCanReadCount(pBVar8);
        pBVar2 = pBVar8->nextpkt;
        (this->super_Buffer).m_writeHead = pBVar2;
        (*(this->super_PollObj)._vptr_PollObj[10])(this,pBVar8);
        if ((pBVar2 == (BufferChain *)0x0) ||
           (sVar5 = sVar5 - (ulong)uVar3, pBVar8 = pBVar2, sVar5 == 0)) goto LAB_00104833;
      }
      pBVar8->read = pBVar8->read + (short)sVar5;
LAB_00104833:
      pBVar8 = (this->super_Buffer).m_writeHead;
    }
    if (pBVar8 == (BufferChain *)0x0) {
      (this->super_Buffer).m_writeTail = (BufferChain *)0x0;
      Poller::Mod((this->super_PollObj).m_pPoller,&this->super_PollObj,0x11);
      return;
    }
  }
  return;
}

Assistant:

void TcpConn::OnWrite()
{
    assert(m_writeHead != nullptr);

    // 写入网络数据
#define maxionum 256
    static struct iovec iov[maxionum];
    BufferChain* pkt = m_writeHead;
    int iocount = 0;
    while(pkt != NULL)
    {
        if(iocount >= maxionum)
        {
            break;
        }
        iov[iocount].iov_base = pkt->GetReadAddr();
        iov[iocount].iov_len = pkt->GetCanReadCount();
        pkt = pkt->nextpkt;
        iocount++;
    }

    //边缘触发 这里也要改 要在这次里写完
    ssize_t wn = writev(GetSockFd(), iov, iocount);
    if(wn < 0)
    {
        return;
    }

    ssize_t count = wn;
    pkt = m_writeHead;
    while(pkt != NULL)
    {
        if(count == 0)
        {
            break;
        }

        if(count < pkt->GetCanReadCount())
        {
            pkt->read += count;
            count = 0;
            break;
        }
        else
        {
            count -= pkt->GetCanReadCount();
            m_writeHead = pkt->nextpkt;
            BufferChain* cur = pkt;
            pkt = pkt->nextpkt;
            Cycle(cur);
        }
    }


    if(m_writeHead == nullptr)
    {
        m_writeTail = nullptr;
        int32_t ret = m_pPoller->Mod(this, EV_READ|EV_ET);
        if(ret != 0)
        {
            return;
        }
    }
}